

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

CubeFace tcu::selectCubeFace(Vec3 *coords)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = coords->m_data[2];
  fVar4 = (float)*(undefined8 *)coords->m_data;
  fVar5 = (float)((ulong)*(undefined8 *)coords->m_data >> 0x20);
  uVar2 = -(uint)(-fVar4 <= fVar4);
  uVar3 = -(uint)(-fVar5 <= fVar5);
  fVar6 = (float)(~uVar2 & (uint)-fVar4 | (uint)fVar4 & uVar2);
  fVar7 = (float)(~uVar3 & (uint)-fVar5 | (uint)fVar5 & uVar3);
  uVar2 = -(uint)(-fVar1 <= fVar1);
  fVar8 = (float)(uVar2 & (uint)fVar1 | ~uVar2 & (uint)-fVar1);
  if ((fVar7 < fVar6) && (fVar8 < fVar6)) goto LAB_001ea07c;
  if ((fVar6 < fVar7) && (fVar8 < fVar7)) goto LAB_001ea092;
  if ((fVar8 <= fVar6) || (fVar8 <= fVar7)) {
    if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
      if ((fVar6 != fVar8) || (NAN(fVar6) || NAN(fVar8))) {
        if ((fVar7 != fVar8) || (fVar7 < fVar6)) goto LAB_001ea07c;
      }
      else if (fVar7 <= fVar8) goto LAB_001ea0cd;
LAB_001ea092:
      return (0.0 <= fVar5) + CUBEFACE_NEGATIVE_Y;
    }
    if (fVar8 <= fVar6) {
LAB_001ea07c:
      return (CubeFace)(0.0 <= fVar4);
    }
  }
LAB_001ea0cd:
  return CUBEFACE_POSITIVE_Z - (fVar1 < 0.0);
}

Assistant:

T						z			(void) const { DE_STATIC_ASSERT(Size >= 3); return m_data[2]; }